

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int PatchPointer(int ptrNum)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  FState *state;
  PClassActor *pPVar5;
  int frame;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)ptrNum;
  pcVar3 = strchr(Line2,0x28);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = strchr(pcVar3 + 1,0x20);
  }
  if (ptrNum == 0) {
    if (pcVar3 == (char *)0x0) {
      uVar7 = 0;
    }
    else {
      pcVar4 = strchr(pcVar3 + 1,0x29);
      *pcVar4 = '\0';
      iVar1 = atoi(pcVar3 + 1);
      if ((ulong)CodePConv.Count == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        do {
          if (CodePConv.Array[uVar7] == iVar1) goto LAB_00486850;
          uVar7 = uVar7 + 1;
        } while (CodePConv.Count != uVar7);
        uVar7 = (ulong)CodePConv.Count;
      }
LAB_00486850:
      DPrintf(4,"Final ptrNum: %i\n",uVar7 & 0xffffffff);
    }
  }
  uVar6 = (uint)uVar7;
  if (((int)uVar6 < 0) || (CodePConv.Count <= uVar6)) {
    Printf("Pointer %d out of range.\n",uVar7 & 0xffffffff);
    uVar6 = 0xffffffff;
  }
  else {
    DPrintf(4,"Pointer %d\n",uVar7 & 0xffffffff);
  }
  iVar1 = GetLine();
  if (iVar1 == 1) {
    do {
      if ((uVar6 < CodePConv.Count) && (iVar1 = strcasecmp(Line1,"Codep Frame"), iVar1 == 0)) {
        state = FindState(CodePConv.Array[(int)uVar6]);
        if (state == (FState *)0x0) {
          Printf("Bad code pointer %d\n",(ulong)uVar6);
        }
        else {
          uVar2 = atoi(Line2);
          if (uVar2 < Actions.Count) {
            SetPointer(state,Actions.Array[(int)uVar2],frame);
          }
          else {
            state->ActionFunc = (VMFunction *)0x0;
          }
          pPVar5 = FState::StaticFindStateOwner(state);
          DPrintf(4,"%s has a hacked state for pointer num %i with index %i\nLine1=%s, Line2=%s\n",
                  FName::NameData.NameArray
                  [(pPVar5->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text,
                  (ulong)uVar6,(ulong)uVar2,Line1,Line2);
        }
      }
      else {
        Printf("Unknown key %s encountered in %s %d.\n",Line1,"Pointer",(ulong)uVar6);
      }
      iVar1 = GetLine();
    } while (iVar1 == 1);
  }
  return iVar1;
}

Assistant:

static int PatchPointer (int ptrNum)
{
	int result;

	// Hack for some Boom dehacked patches that are of the form Pointer 0 (x statenumber)
	char * key;
	int indexnum;
	key=strchr(Line2, '(');
	if (key++) key=strchr(key, ' '); else key=NULL;
	if ((ptrNum == 0) && key++)
	{
		*strchr(key, ')') = '\0';
		indexnum = atoi(key);
		for (ptrNum = 0; (unsigned int) ptrNum < CodePConv.Size(); ++ptrNum)
		{
			if (CodePConv[ptrNum] == indexnum) break;
		}
		DPrintf(DMSG_SPAMMY, "Final ptrNum: %i\n", ptrNum);
	}
	// End of hack.

	// 448 Doom states with codepointers + 74 extra MBF states with codepointers = 522 total
	// Better to just use the size of the array rather than a hardcoded value.
	if (ptrNum >= 0 && (unsigned int) ptrNum < CodePConv.Size())
	{
		DPrintf (DMSG_SPAMMY, "Pointer %d\n", ptrNum);
	}
	else
	{
		Printf ("Pointer %d out of range.\n", ptrNum);
		ptrNum = -1;
	}

	while ((result = GetLine ()) == 1)
	{
		if ((unsigned)ptrNum < CodePConv.Size() && (!stricmp (Line1, "Codep Frame")))
		{
			FState *state = FindState (CodePConv[ptrNum]);
			if (state)
			{
				int index = atoi(Line2);
				if ((unsigned)(index) >= Actions.Size())
				{
					SetPointer(state, NULL);
				}
				else
				{
					SetPointer(state, Actions[index], CodePConv[ptrNum]);
				}
				DPrintf(DMSG_SPAMMY, "%s has a hacked state for pointer num %i with index %i\nLine1=%s, Line2=%s\n", 
					state->StaticFindStateOwner(state)->TypeName.GetChars(), ptrNum, index, Line1, Line2);
			}
			else
			{
				Printf ("Bad code pointer %d\n", ptrNum);
			}
		}
		else Printf (unknown_str, Line1, "Pointer", ptrNum);
	}
	return result;
}